

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkTransferPhases(Abc_Ntk_t *pNtkNew,Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint i_00;
  Vec_Int_t *pVVar3;
  Abc_Obj_t *pAVar4;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkNew_local;
  
  if (pNtk->vPhases == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vPhases != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xb6f,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  iVar1 = Vec_IntSize(pNtk->vPhases);
  iVar2 = Abc_NtkObjNumMax(pNtk);
  if (iVar1 == iVar2) {
    if (pNtkNew->vPhases == (Vec_Int_t *)0x0) {
      iVar1 = Abc_NtkObjNumMax(pNtkNew);
      pVVar3 = Vec_IntStart(iVar1);
      pNtkNew->vPhases = pVVar3;
      for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1
          ) {
        pAVar4 = Abc_NtkObj(pNtk,local_24);
        if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp != (void *)0x0)) &&
           (iVar1 = Abc_ObjIsNone((pAVar4->field_6).pCopy), iVar1 == 0)) {
          pVVar3 = pNtkNew->vPhases;
          i_00 = Abc_ObjId((pAVar4->field_6).pCopy);
          iVar1 = Vec_IntEntry(pNtk->vPhases,local_24);
          Vec_IntWriteEntry(pVVar3,i_00,iVar1);
        }
      }
      return;
    }
    __assert_fail("pNtkNew->vPhases == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                  ,0xb71,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  __assert_fail("Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcUtil.c"
                ,0xb70,"void Abc_NtkTransferPhases(Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Abc_NtkTransferPhases( Abc_Ntk_t * pNtkNew, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( pNtk->vPhases != NULL );
    assert( Vec_IntSize(pNtk->vPhases) == Abc_NtkObjNumMax(pNtk) );
    assert( pNtkNew->vPhases == NULL );
    pNtkNew->vPhases = Vec_IntStart( Abc_NtkObjNumMax(pNtkNew) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy && !Abc_ObjIsNone( (Abc_Obj_t *)pObj->pCopy ) )
            Vec_IntWriteEntry( pNtkNew->vPhases, Abc_ObjId( (Abc_Obj_t *)pObj->pCopy ), Vec_IntEntry(pNtk->vPhases, i) );
}